

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve_copy_avx2.c
# Opt level: O0

void highbd_copy_128(uint16_t *src,uint16_t *dst)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  __m256i s [8];
  
  uVar1 = in_RDI[1];
  uVar2 = in_RDI[2];
  uVar3 = in_RDI[3];
  uVar4 = in_RDI[4];
  uVar5 = in_RDI[5];
  uVar6 = in_RDI[6];
  uVar7 = in_RDI[7];
  uVar8 = in_RDI[8];
  uVar9 = in_RDI[9];
  uVar10 = in_RDI[10];
  uVar11 = in_RDI[0xb];
  uVar12 = in_RDI[0xc];
  uVar13 = in_RDI[0xd];
  uVar14 = in_RDI[0xe];
  uVar15 = in_RDI[0xf];
  uVar16 = in_RDI[0x10];
  uVar17 = in_RDI[0x11];
  uVar18 = in_RDI[0x12];
  uVar19 = in_RDI[0x13];
  uVar20 = in_RDI[0x14];
  uVar21 = in_RDI[0x15];
  uVar22 = in_RDI[0x16];
  uVar23 = in_RDI[0x17];
  uVar24 = in_RDI[0x18];
  uVar25 = in_RDI[0x19];
  uVar26 = in_RDI[0x1a];
  uVar27 = in_RDI[0x1b];
  uVar28 = in_RDI[0x1c];
  uVar29 = in_RDI[0x1d];
  uVar30 = in_RDI[0x1e];
  uVar31 = in_RDI[0x1f];
  *in_RSI = *in_RDI;
  in_RSI[1] = uVar1;
  in_RSI[2] = uVar2;
  in_RSI[3] = uVar3;
  in_RSI[4] = uVar4;
  in_RSI[5] = uVar5;
  in_RSI[6] = uVar6;
  in_RSI[7] = uVar7;
  in_RSI[8] = uVar8;
  in_RSI[9] = uVar9;
  in_RSI[10] = uVar10;
  in_RSI[0xb] = uVar11;
  in_RSI[0xc] = uVar12;
  in_RSI[0xd] = uVar13;
  in_RSI[0xe] = uVar14;
  in_RSI[0xf] = uVar15;
  in_RSI[0x10] = uVar16;
  in_RSI[0x11] = uVar17;
  in_RSI[0x12] = uVar18;
  in_RSI[0x13] = uVar19;
  in_RSI[0x14] = uVar20;
  in_RSI[0x15] = uVar21;
  in_RSI[0x16] = uVar22;
  in_RSI[0x17] = uVar23;
  in_RSI[0x18] = uVar24;
  in_RSI[0x19] = uVar25;
  in_RSI[0x1a] = uVar26;
  in_RSI[0x1b] = uVar27;
  in_RSI[0x1c] = uVar28;
  in_RSI[0x1d] = uVar29;
  in_RSI[0x1e] = uVar30;
  in_RSI[0x1f] = uVar31;
  return;
}

Assistant:

static inline void highbd_copy_128(const uint16_t *src, uint16_t *dst) {
  __m256i s[8];
  s[0] = _mm256_loadu_si256((__m256i *)(src + 0 * 16));
  s[1] = _mm256_loadu_si256((__m256i *)(src + 1 * 16));
  s[2] = _mm256_loadu_si256((__m256i *)(src + 2 * 16));
  s[3] = _mm256_loadu_si256((__m256i *)(src + 3 * 16));
  s[4] = _mm256_loadu_si256((__m256i *)(src + 4 * 16));
  s[5] = _mm256_loadu_si256((__m256i *)(src + 5 * 16));
  s[6] = _mm256_loadu_si256((__m256i *)(src + 6 * 16));
  s[7] = _mm256_loadu_si256((__m256i *)(src + 7 * 16));

  _mm256_storeu_si256((__m256i *)(dst + 0 * 16), s[0]);
  _mm256_storeu_si256((__m256i *)(dst + 1 * 16), s[1]);
  _mm256_storeu_si256((__m256i *)(dst + 2 * 16), s[2]);
  _mm256_storeu_si256((__m256i *)(dst + 3 * 16), s[3]);
  _mm256_storeu_si256((__m256i *)(dst + 4 * 16), s[4]);
  _mm256_storeu_si256((__m256i *)(dst + 5 * 16), s[5]);
  _mm256_storeu_si256((__m256i *)(dst + 6 * 16), s[6]);
  _mm256_storeu_si256((__m256i *)(dst + 7 * 16), s[7]);
}